

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Era(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  uint local_40;
  uint local_3c;
  int nStatesMax;
  int fMiter;
  int fDumpFile;
  int fUseCubes;
  int fVerbose;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  fDumpFile = 0;
  bVar1 = true;
  nStatesMax = 0;
  local_3c = 0;
  local_40 = 1000000000;
  Extra_UtilGetoptReset();
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"Smcdvh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Era(): There is no AIG.\n");
        return 1;
      }
      iVar2 = Gia_ManRegNum(pAbc->pGia);
      if (iVar2 == 0) {
        Abc_Print(-1,"Abc_CommandAbc9Era(): The network is combinational.\n");
        return 1;
      }
      if ((!bVar1) && (iVar2 = Gia_ManPiNum(pAbc->pGia), 0xc < iVar2)) {
        uVar3 = Gia_ManPiNum(pAbc->pGia);
        Abc_Print(-1,
                  "Abc_CommandAbc9Era(): The number of PIs (%d) should be no more than 12 when cubes are not used.\n"
                  ,(ulong)uVar3);
        return 1;
      }
      if ((bVar1) && (nStatesMax == 0)) {
        iVar2 = Gia_ManArePerform(pAbc->pGia,local_40,local_3c,fDumpFile);
        pAbc->Status = iVar2;
      }
      else {
        iVar2 = Gia_ManCollectReachable(pAbc->pGia,local_40,local_3c,nStatesMax,fDumpFile);
        pAbc->Status = iVar2;
      }
      Abc_FrameReplaceCex(pAbc,&pAbc->pGia->pCexSeq);
      return 0;
    }
    switch(iVar2) {
    case 0x53:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-S\" should be followed by a positive integer.\n");
        goto LAB_002b82a2;
      }
      local_40 = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if ((int)local_40 < 0) {
LAB_002b82a2:
        Abc_Print(-2,"usage: &era [-S num] [-mcdvh]\n");
        Abc_Print(-2,"\t          explicit reachability analysis for small sequential AIGs\n");
        Abc_Print(-2,"\t-S num  : the max number of states (num > 0) [default = %d]\n",
                  (ulong)local_40);
        pcVar4 = "no";
        if (local_3c != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-m      : stop when the miter output is 1 [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (bVar1) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-c      : use state cubes instead of state minterms [default = %s]\n",pcVar4
                 );
        pcVar4 = "no";
        if (nStatesMax != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-d      : toggle dumping STG into a file [default = %s]\n",pcVar4);
        pcVar4 = "no";
        if (fDumpFile != 0) {
          pcVar4 = "yes";
        }
        Abc_Print(-2,"\t-v      : print verbose information [default = %s]\n",pcVar4);
        Abc_Print(-2,"\t-h      : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_002b82a2;
    case 99:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 100:
      nStatesMax = nStatesMax ^ 1;
      break;
    case 0x68:
      goto LAB_002b82a2;
    case 0x6d:
      local_3c = local_3c ^ 1;
      break;
    case 0x76:
      fDumpFile = fDumpFile ^ 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Era( Abc_Frame_t * pAbc, int argc, char ** argv )
{
//    Gia_Man_t * pTemp = NULL;
    int c, fVerbose = 0;
    int fUseCubes = 1;
    int fDumpFile = 0;
    int fMiter = 0;
    int nStatesMax = 1000000000;
    extern int Gia_ManCollectReachable( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fDumpFile, int fVerbose );
    extern int Gia_ManArePerform( Gia_Man_t * pAig, int nStatesMax, int fMiter, int fVerbose );

    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Smcdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'S':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-S\" should be followed by a positive integer.\n" );
                goto usage;
            }
            nStatesMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nStatesMax < 0 )
                goto usage;
            break;
        case 'm':
            fMiter ^= 1;
            break;
        case 'c':
            fUseCubes ^= 1;
            break;
        case 'd':
            fDumpFile ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Era(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Era(): The network is combinational.\n" );
        return 1;
    }
    if ( !fUseCubes && Gia_ManPiNum(pAbc->pGia) > 12 )
    {
        Abc_Print( -1, "Abc_CommandAbc9Era(): The number of PIs (%d) should be no more than 12 when cubes are not used.\n", Gia_ManPiNum(pAbc->pGia) );
        return 1;
    }
    if ( fUseCubes && !fDumpFile )
        pAbc->Status = Gia_ManArePerform( pAbc->pGia, nStatesMax, fMiter, fVerbose );
    else
        pAbc->Status = Gia_ManCollectReachable( pAbc->pGia, nStatesMax, fMiter, fDumpFile, fVerbose );
    Abc_FrameReplaceCex( pAbc, &pAbc->pGia->pCexSeq );
    return 0;

usage:
    Abc_Print( -2, "usage: &era [-S num] [-mcdvh]\n" );
    Abc_Print( -2, "\t          explicit reachability analysis for small sequential AIGs\n" );
    Abc_Print( -2, "\t-S num  : the max number of states (num > 0) [default = %d]\n", nStatesMax );
    Abc_Print( -2, "\t-m      : stop when the miter output is 1 [default = %s]\n", fMiter? "yes": "no" );
    Abc_Print( -2, "\t-c      : use state cubes instead of state minterms [default = %s]\n", fUseCubes? "yes": "no" );
    Abc_Print( -2, "\t-d      : toggle dumping STG into a file [default = %s]\n", fDumpFile? "yes": "no" );
    Abc_Print( -2, "\t-v      : print verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h      : print the command usage\n");
    return 1;
}